

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_argument_buffer_aliased_descriptor
          (CompilerMSL *this,SPIRVariable *aliased_var,SPIRVariable *base_var)

{
  ID *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t id;
  size_t __n;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Meta *pMVar6;
  SPIRType *pSVar7;
  SPIRType *type;
  char *pcVar8;
  mapped_type *pmVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char (*ts_9) [3];
  char (*in_stack_fffffffffffffed8) [3];
  string ref_type;
  string name;
  string local_d8;
  string unqualified_name;
  string local_98;
  string descriptor_storage;
  char *local_58;
  string local_50;
  
  pMVar6 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,
                               (ID)(base_var->super_IVariant).self.id);
  if (pMVar6 == (Meta *)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&unqualified_name,this,(ulong)(base_var->super_IVariant).self.id,0);
  }
  else {
    bVar4 = (pMVar6->decoration).qualified_alias_explicit_override;
    (pMVar6->decoration).qualified_alias_explicit_override = false;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&unqualified_name,this,(ulong)(base_var->super_IVariant).self.id,0);
    (pMVar6->decoration).qualified_alias_explicit_override = bVar4;
  }
  if (((2 < unqualified_name._M_string_length) && (*unqualified_name._M_dataplus._M_p == '(')) &&
     (unqualified_name._M_dataplus._M_p[1] == '*')) {
    ::std::__cxx11::string::_M_erase((ulong)&unqualified_name,0);
    ::std::__cxx11::string::pop_back();
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(aliased_var->super_IVariant).field_0xc);
  type = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
  pcVar8 = descriptor_address_space
                     (this,(aliased_var->super_IVariant).self.id,aliased_var->storage,"");
  ::std::__cxx11::string::string((string *)&descriptor_storage,pcVar8,(allocator *)&ref_type);
  __k = &(aliased_var->super_IVariant).self;
  if (aliased_var->storage == StorageClassUniformConstant) {
    bVar4 = is_var_runtime_size_array(this,aliased_var);
    if (bVar4) {
      pSVar7 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      type_to_glsl_abi_cxx11_(&local_d8,this,pSVar7,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&ref_type,(spirv_cross *)0x3b001a,(char (*) [18])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641,
                 (char (*) [2])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a582a,
                 (char (*) [4])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b224b,
                 (char (*) [2])in_stack_fffffffffffffed8);
      ::std::__cxx11::string::operator=((string *)&name,(string *)&ref_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ref_type._M_dataplus._M_p != &ref_type.field_2) {
        operator_delete(ref_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00265ff1;
    }
    else {
      pSVar7 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      type_to_glsl_abi_cxx11_(&local_d8,this,pSVar7,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[3]>
                (&ref_type,(spirv_cross *)0x3b001a,(char (*) [18])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641,
                 (char (*) [2])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" &>(",
                 (char (*) [5])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b1288,
                 in_stack_fffffffffffffed8);
      ::std::__cxx11::string::operator=((string *)&name,(string *)&ref_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ref_type._M_dataplus._M_p != &ref_type.field_2) {
        operator_delete(ref_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00265ff1;
    }
  }
  else {
    bVar4 = this->is_using_builtin_array;
    this->is_using_builtin_array = true;
    bVar2 = Compiler::is_array((Compiler *)this,type);
    if (bVar2) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)__k->id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_d8,this,pSVar7);
      join<char_const(&)[4],std::__cxx11::string>
                (&ref_type,(spirv_cross *)0x398055,(char (*) [4])&local_d8,ts_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    else {
      ref_type._M_dataplus._M_p = (pointer)&ref_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ref_type,"&","");
    }
    bVar3 = is_var_runtime_size_array(this,aliased_var);
    if (bVar3) {
      type_to_glsl_abi_cxx11_(&local_50,this,pSVar7,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2]>
                (&local_98,(spirv_cross *)0x3b001a,(char (*) [18])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641,
                 (char (*) [2])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" *>(&",
                 (char (*) [6])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b224b,
                 (char (*) [2])in_stack_fffffffffffffed8);
      ::std::__cxx11::string::operator=((string *)&name,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00265ecc:
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    else {
      local_58 = "*";
      if (bVar2) {
        local_58 = "";
      }
      ts_9 = (char (*) [3])0x265e35;
      type_to_glsl_abi_cxx11_(&local_50,this,pSVar7,__k->id,true);
      join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&local_98,(spirv_cross *)&local_58,(char **)0x3b001a,(char (*) [18])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641,
                 (char (*) [2])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x378641,
                 (char (*) [2])&ref_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a5825,
                 (char (*) [3])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b1288,ts_9)
      ;
      ::std::__cxx11::string::operator=((string *)&name,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00265ecc;
    }
    if (!bVar2) {
      get_type_address_space_abi_cxx11_(&local_98,this,pSVar7,__k->id,false);
      ::std::__cxx11::string::operator=((string *)&descriptor_storage,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    if (this->suppress_incompatible_pointer_types_discard_qualifiers == false) {
      this->suppress_incompatible_pointer_types_discard_qualifiers = true;
      Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
    }
    this->is_using_builtin_array = bVar4;
    local_d8._M_dataplus._M_p = ref_type._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ref_type._M_dataplus._M_p == &ref_type.field_2) goto LAB_00265ff1;
  }
  operator_delete(local_d8._M_dataplus._M_p);
LAB_00265ff1:
  bVar4 = is_var_runtime_size_array(this,aliased_var);
  if (bVar4) {
    pmVar9 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    __n = (pmVar9->decoration).qualified_alias._M_string_length;
    if ((__n != name._M_string_length) ||
       ((__n != 0 &&
        (iVar5 = bcmp((pmVar9->decoration).qualified_alias._M_dataplus._M_p,name._M_dataplus._M_p,
                      __n), iVar5 != 0)))) {
      Compiler::force_recompile((Compiler *)this);
    }
    Compiler::set_qualified_name((Compiler *)this,__k->id,&name);
  }
  else {
    id = __k->id;
    paVar1 = &ref_type.field_2;
    ref_type._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&ref_type,"");
    Compiler::set_qualified_name((Compiler *)this,id,&ref_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ref_type._M_dataplus._M_p != paVar1) {
      operator_delete(ref_type._M_dataplus._M_p);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&ref_type,this,(ulong)__k->id,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&>
              (&this->super_CompilerGLSL,&descriptor_storage,(char (*) [8])" auto &",&ref_type,
               (char (*) [4])0x3a613c,&name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ref_type._M_dataplus._M_p != paVar1) {
      operator_delete(ref_type._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)descriptor_storage._M_dataplus._M_p != &descriptor_storage.field_2) {
    operator_delete(descriptor_storage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unqualified_name._M_dataplus._M_p != &unqualified_name.field_2) {
    operator_delete(unqualified_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_argument_buffer_aliased_descriptor(const SPIRVariable &aliased_var,
                                                          const SPIRVariable &base_var)
{
	// To deal with buffer <-> image aliasing, we need to perform an unholy UB ritual.
	// A texture type in Metal 3.0 is a pointer. However, we cannot simply cast a pointer to texture.
	// What we *can* do is to cast pointer-to-pointer to pointer-to-texture.

	// We need to explicitly reach into the descriptor buffer lvalue, not any spvDescriptorArray wrapper.
	auto *var_meta = ir.find_meta(base_var.self);
	bool old_explicit_qualifier = var_meta && var_meta->decoration.qualified_alias_explicit_override;
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = false;
	auto unqualified_name = to_name(base_var.self, false);
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = old_explicit_qualifier;

	// For non-arrayed buffers, we have already performed a de-reference.
	// We need a proper lvalue to cast, so strip away the de-reference.
	if (unqualified_name.size() > 2 && unqualified_name[0] == '(' && unqualified_name[1] == '*')
	{
		unqualified_name.erase(unqualified_name.begin(), unqualified_name.begin() + 2);
		unqualified_name.pop_back();
	}

	string name;

	auto &var_type = get<SPIRType>(aliased_var.basetype);
	auto &data_type = get_variable_data_type(aliased_var);
	string descriptor_storage = descriptor_address_space(aliased_var.self, aliased_var.storage, "");

	if (aliased_var.storage == StorageClassUniformConstant)
	{
		if (is_var_runtime_size_array(aliased_var))
		{
			// This becomes a plain pointer to spvDescriptor.
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), ">(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), " &>(",
			            unqualified_name, ");");
		}
	}
	else
	{
		// Buffer types.
		bool old_is_using_builtin_array = is_using_builtin_array;
		is_using_builtin_array = true;

		bool needs_post_cast_deref = !is_array(data_type);
		string ref_type = needs_post_cast_deref ? "&" : join("(&)", type_to_array_glsl(var_type, aliased_var.self));

		if (is_var_runtime_size_array(aliased_var))
		{
			name = join("reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " *>(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join(needs_post_cast_deref ? "*" : "", "reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " ",
			            ref_type,
			            ">(", unqualified_name, ");");
		}

		if (needs_post_cast_deref)
			descriptor_storage = get_type_address_space(var_type, aliased_var.self, false);

		// These kinds of ridiculous casts trigger warnings in compiler. Just ignore them.
		if (!suppress_incompatible_pointer_types_discard_qualifiers)
		{
			suppress_incompatible_pointer_types_discard_qualifiers = true;
			force_recompile_guarantee_forward_progress();
		}

		is_using_builtin_array = old_is_using_builtin_array;
	}

	if (!is_var_runtime_size_array(aliased_var))
	{
		// Lower to temporary, so drop the qualification.
		set_qualified_name(aliased_var.self, "");
		statement(descriptor_storage, " auto &", to_name(aliased_var.self), " = ", name);
	}
	else
	{
		// This alias may have already been used to emit an entry point declaration. If there is a mismatch, we need a recompile.
		// Moving this code to be run earlier will also conflict,
		// because we need the qualified alias for the base resource,
		// so forcing recompile until things sync up is the least invasive method for now.
		if (ir.meta[aliased_var.self].decoration.qualified_alias != name)
			force_recompile();

		// This will get wrapped in a separate temporary when a spvDescriptorArray wrapper is emitted.
		set_qualified_name(aliased_var.self, name);
	}
}